

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitCallIndirect(BinaryInstWriter *this,CallIndirect *curr)

{
  uint32_t value;
  BufferWithRandomAccess *pBVar1;
  U32LEB local_44;
  uintptr_t local_40;
  U32LEB local_38;
  int8_t local_31;
  size_t sStack_30;
  int8_t op;
  char *local_28;
  uint32_t local_1c;
  CallIndirect *pCStack_18;
  Index tableIdx;
  CallIndirect *curr_local;
  BinaryInstWriter *this_local;
  
  sStack_30 = (curr->table).super_IString.str._M_len;
  local_28 = (curr->table).super_IString.str._M_str;
  pCStack_18 = curr;
  curr_local = (CallIndirect *)this;
  local_1c = WasmBinaryWriter::getTableIndex(this->parent,(Name)(curr->table).super_IString.str);
  local_31 = '\x11';
  if ((pCStack_18->isReturn & 1U) != 0) {
    local_31 = '\x13';
  }
  pBVar1 = BufferWithRandomAccess::operator<<(this->o,local_31);
  local_40 = (pCStack_18->heapType).id;
  value = WasmBinaryWriter::getTypeIndex(this->parent,(HeapType)local_40);
  LEB<unsigned_int,_unsigned_char>::LEB(&local_38,value);
  pBVar1 = BufferWithRandomAccess::operator<<(pBVar1,local_38);
  LEB<unsigned_int,_unsigned_char>::LEB(&local_44,local_1c);
  BufferWithRandomAccess::operator<<(pBVar1,local_44);
  return;
}

Assistant:

void BinaryInstWriter::visitCallIndirect(CallIndirect* curr) {
  Index tableIdx = parent.getTableIndex(curr->table);
  int8_t op =
    curr->isReturn ? BinaryConsts::RetCallIndirect : BinaryConsts::CallIndirect;
  o << op << U32LEB(parent.getTypeIndex(curr->heapType)) << U32LEB(tableIdx);
}